

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_settings.cpp
# Opt level: O3

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBSettingsInit(ClientContext *context,TableFunctionInitInput *input)

{
  set_global_function_t p_Var1;
  undefined8 uVar2;
  char *pcVar3;
  SettingLookupResult value_00;
  idx_t iVar4;
  char *pcVar5;
  pointer pDVar6;
  _Hash_node_base *p_Var7;
  idx_t target_index;
  optional_ptr<const_duckdb::ConfigurationOption,_true> option;
  DuckDBSettingValue value;
  string setting_str_val;
  Value setting_val;
  allocator local_191;
  _Head_base<0UL,_duckdb::DuckDBSettingsData_*,_false> local_190;
  undefined1 local_188 [32];
  undefined1 local_168 [32];
  _Alloc_hider local_148;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Alloc_hider local_128;
  char *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108;
  char *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  ClientContext *local_c8;
  string local_c0;
  __uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  local_a0;
  DBConfig *local_98;
  idx_t local_90;
  Value local_88;
  LogicalType local_48;
  
  local_a0._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl =
       (tuple<duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
        )(tuple<duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )context;
  local_190._M_head_impl = (DuckDBSettingsData *)operator_new(0x28);
  ((local_190._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__DuckDBSettingsData_0243de50;
  ((local_190._M_head_impl)->settings).
  super_vector<duckdb::DuckDBSettingValue,_std::allocator<duckdb::DuckDBSettingValue>_>.
  super__Vector_base<duckdb::DuckDBSettingValue,_std::allocator<duckdb::DuckDBSettingValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&((local_190._M_head_impl)->settings).
           super_vector<duckdb::DuckDBSettingValue,_std::allocator<duckdb::DuckDBSettingValue>_>.
           super__Vector_base<duckdb::DuckDBSettingValue,_std::allocator<duckdb::DuckDBSettingValue>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&((local_190._M_head_impl)->settings).
           super_vector<duckdb::DuckDBSettingValue,_std::allocator<duckdb::DuckDBSettingValue>_>.
           super__Vector_base<duckdb::DuckDBSettingValue,_std::allocator<duckdb::DuckDBSettingValue>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_190._M_head_impl)->offset = 0;
  local_c8 = (ClientContext *)input;
  local_98 = DBConfig::GetConfig((ClientContext *)input);
  iVar4 = DBConfig::GetOptionCount();
  if (iVar4 != 0) {
    target_index = 0;
    local_90 = iVar4;
    do {
      local_188._0_8_ = DBConfig::GetOptionByIndex(target_index);
      local_168._8_8_ = (char *)0x0;
      local_168[0x10] = '\0';
      local_140 = 0;
      local_138._M_local_buf[0] = '\0';
      local_128._M_p = (pointer)&local_118;
      local_120 = (char *)0x0;
      local_118._M_local_buf[0] = '\0';
      local_108._M_p = (pointer)&local_f8;
      local_100 = (char *)0x0;
      local_f8._M_local_buf[0] = '\0';
      local_e8._M_p = (pointer)&local_d8;
      local_e0 = 0;
      local_d8._M_local_buf[0] = '\0';
      local_168._0_8_ = local_168 + 0x10;
      local_148._M_p = (pointer)&local_138;
      optional_ptr<const_duckdb::ConfigurationOption,_true>::CheckValid
                ((optional_ptr<const_duckdb::ConfigurationOption,_true> *)local_188);
      p_Var1 = *(set_global_function_t *)(local_188._0_8_ + 0x18);
      optional_ptr<const_duckdb::ConfigurationOption,_true>::CheckValid
                ((optional_ptr<const_duckdb::ConfigurationOption,_true> *)local_188);
      uVar2 = local_168._8_8_;
      pcVar5 = *(char **)local_188._0_8_;
      strlen(pcVar5);
      ::std::__cxx11::string::_M_replace((ulong)local_168,0,(char *)uVar2,(ulong)pcVar5);
      optional_ptr<const_duckdb::ConfigurationOption,_true>::CheckValid
                ((optional_ptr<const_duckdb::ConfigurationOption,_true> *)local_188);
      (**(get_setting_function_t *)(local_188._0_8_ + 0x38))(&local_88,local_c8);
      Value::ToString_abi_cxx11_(&local_c0,&local_88);
      ::std::__cxx11::string::operator=((string *)&local_148,(string *)&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      Value::~Value(&local_88);
      optional_ptr<const_duckdb::ConfigurationOption,_true>::CheckValid
                ((optional_ptr<const_duckdb::ConfigurationOption,_true> *)local_188);
      pcVar3 = local_120;
      pcVar5 = *(char **)(local_188._0_8_ + 8);
      strlen(pcVar5);
      ::std::__cxx11::string::_M_replace((ulong)&local_128,0,pcVar3,(ulong)pcVar5);
      optional_ptr<const_duckdb::ConfigurationOption,_true>::CheckValid
                ((optional_ptr<const_duckdb::ConfigurationOption,_true> *)local_188);
      pcVar3 = local_100;
      pcVar5 = *(char **)(local_188._0_8_ + 0x10);
      strlen(pcVar5);
      ::std::__cxx11::string::_M_replace((ulong)&local_108,0,pcVar3,(ulong)pcVar5);
      pcVar5 = EnumUtil::ToChars<duckdb::SettingScope>(p_Var1 == (set_global_function_t)0x0);
      ::std::__cxx11::string::string((string *)&local_88,pcVar5,(allocator *)&local_c0);
      ::std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_88);
      if ((undefined1 **)local_88.type_._0_8_ != (undefined1 **)((long)&local_88 + 0x10U)) {
        operator_delete((void *)local_88.type_._0_8_);
      }
      pDVar6 = unique_ptr<duckdb::DuckDBSettingsData,_std::default_delete<duckdb::DuckDBSettingsData>,_true>
               ::operator->((unique_ptr<duckdb::DuckDBSettingsData,_std::default_delete<duckdb::DuckDBSettingsData>,_true>
                             *)&local_190);
      ::std::vector<duckdb::DuckDBSettingValue,_std::allocator<duckdb::DuckDBSettingValue>_>::
      emplace_back<duckdb::DuckDBSettingValue>
                (&(pDVar6->settings).
                  super_vector<duckdb::DuckDBSettingValue,_std::allocator<duckdb::DuckDBSettingValue>_>
                 ,(DuckDBSettingValue *)local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_p != &local_d8) {
        operator_delete(local_e8._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p != &local_f8) {
        operator_delete(local_108._M_p);
      }
      iVar4 = local_90;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_p != &local_118) {
        operator_delete(local_128._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_p != &local_138) {
        operator_delete(local_148._M_p);
      }
      if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
        operator_delete((void *)local_168._0_8_);
      }
      target_index = target_index + 1;
    } while (iVar4 != target_index);
  }
  p_Var7 = (local_98->extension_parameters)._M_h._M_before_begin._M_nxt;
  if (p_Var7 != (_Hash_node_base *)0x0) {
    do {
      LogicalType::LogicalType(&local_48,SQLNULL);
      Value::Value(&local_88,&local_48);
      LogicalType::~LogicalType(&local_48);
      local_c0._M_string_length = 0;
      local_c0.field_2._M_local_buf[0] = '\0';
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      value_00 = ClientContext::TryGetCurrentSetting(local_c8,(string *)(p_Var7 + 1),&local_88);
      if (value_00.scope == INVALID) {
        value_00.scope = GLOBAL;
      }
      else {
        Value::ToString_abi_cxx11_((string *)local_168,&local_88);
        ::std::__cxx11::string::operator=((string *)&local_c0,(string *)local_168);
        if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
          operator_delete((void *)local_168._0_8_);
        }
      }
      local_168._0_8_ = local_168 + 0x10;
      local_168._8_8_ = (char *)0x0;
      local_168[0x10] = '\0';
      local_148._M_p = (pointer)&local_138;
      local_140 = 0;
      local_138._M_local_buf[0] = '\0';
      local_128._M_p = (pointer)&local_118;
      local_120 = (char *)0x0;
      local_118._M_local_buf[0] = '\0';
      local_108._M_p = (pointer)&local_f8;
      local_100 = (char *)0x0;
      local_f8._M_local_buf[0] = '\0';
      local_e8._M_p = (pointer)&local_d8;
      local_e0 = 0;
      local_d8._M_local_buf[0] = '\0';
      ::std::__cxx11::string::_M_assign((string *)local_168);
      ::std::__cxx11::string::operator=((string *)&local_148,(string *)&local_c0);
      ::std::__cxx11::string::_M_assign((string *)&local_128);
      LogicalType::ToString_abi_cxx11_((string *)local_188,(LogicalType *)(p_Var7 + 9));
      ::std::__cxx11::string::operator=((string *)&local_108,(string *)local_188);
      if ((ConfigurationOption *)local_188._0_8_ != (ConfigurationOption *)(local_188 + 0x10)) {
        operator_delete((void *)local_188._0_8_);
      }
      pcVar5 = EnumUtil::ToChars<duckdb::SettingScope>(value_00.scope);
      ::std::__cxx11::string::string((string *)local_188,pcVar5,&local_191);
      ::std::__cxx11::string::operator=((string *)&local_e8,(string *)local_188);
      if ((ConfigurationOption *)local_188._0_8_ != (ConfigurationOption *)(local_188 + 0x10)) {
        operator_delete((void *)local_188._0_8_);
      }
      pDVar6 = unique_ptr<duckdb::DuckDBSettingsData,_std::default_delete<duckdb::DuckDBSettingsData>,_true>
               ::operator->((unique_ptr<duckdb::DuckDBSettingsData,_std::default_delete<duckdb::DuckDBSettingsData>,_true>
                             *)&local_190);
      ::std::vector<duckdb::DuckDBSettingValue,_std::allocator<duckdb::DuckDBSettingValue>_>::
      emplace_back<duckdb::DuckDBSettingValue>
                (&(pDVar6->settings).
                  super_vector<duckdb::DuckDBSettingValue,_std::allocator<duckdb::DuckDBSettingValue>_>
                 ,(DuckDBSettingValue *)local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_p != &local_d8) {
        operator_delete(local_e8._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p != &local_f8) {
        operator_delete(local_108._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_p != &local_118) {
        operator_delete(local_128._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_p != &local_138) {
        operator_delete(local_148._M_p);
      }
      if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
        operator_delete((void *)local_168._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      Value::~Value(&local_88);
      p_Var7 = p_Var7->_M_nxt;
    } while (p_Var7 != (_Hash_node_base *)0x0);
  }
  *(DuckDBSettingsData **)
   local_a0._M_t.
   super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
   .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl =
       local_190._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(_Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )local_a0._M_t.
             super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
             .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBSettingsInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBSettingsData>();

	auto &config = DBConfig::GetConfig(context);
	auto options_count = DBConfig::GetOptionCount();
	for (idx_t i = 0; i < options_count; i++) {
		auto option = DBConfig::GetOptionByIndex(i);
		D_ASSERT(option);
		DuckDBSettingValue value;
		auto scope = option->set_global ? SettingScope::GLOBAL : SettingScope::LOCAL;
		value.name = option->name;
		value.value = option->get_setting(context).ToString();
		value.description = option->description;
		value.input_type = option->parameter_type;
		value.scope = EnumUtil::ToString(scope);

		result->settings.push_back(std::move(value));
	}
	for (auto &ext_param : config.extension_parameters) {
		Value setting_val;
		string setting_str_val;
		auto scope = SettingScope::GLOBAL;
		auto lookup_result = context.TryGetCurrentSetting(ext_param.first, setting_val);
		if (lookup_result) {
			setting_str_val = setting_val.ToString();
			scope = lookup_result.GetScope();
		}
		DuckDBSettingValue value;
		value.name = ext_param.first;
		value.value = std::move(setting_str_val);
		value.description = ext_param.second.description;
		value.input_type = ext_param.second.type.ToString();
		value.scope = EnumUtil::ToString(scope);

		result->settings.push_back(std::move(value));
	}
	return std::move(result);
}